

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

void Bac_NtkUpdateFanout(Bac_Ntk_t *p,int iOld,int iNew)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  uint i;
  
  if (-1 < iOld) {
    uVar2 = (p->vType).nSize;
    if (iOld < (int)uVar2) {
      pcVar3 = (p->vType).pArray;
      bVar1 = pcVar3[(uint)iOld];
      if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
        __assert_fail("Bac_ObjIsCi(p, iOld)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                      ,0xda,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
      }
      if ((-1 < iNew) && ((uint)iNew < uVar2)) {
        if ((9 < (byte)pcVar3[(uint)iNew]) ||
           ((0x30cU >> ((byte)pcVar3[(uint)iNew] & 0x1f) & 1) == 0)) {
          __assert_fail("Bac_ObjIsCi(p, iNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                        ,0xdb,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
        }
        if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
LAB_003ba25d:
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x125,"int Bac_ObjFanout(Bac_Ntk_t *, int)");
        }
        iVar5 = (p->vFanout).nSize;
        if (iVar5 <= iOld) {
LAB_003ba1c2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = (p->vFanout).pArray;
        i = piVar4[(uint)iOld];
        if (i != 0) {
          do {
            if (((int)i < 0) || ((int)uVar2 <= (int)i)) goto LAB_003ba1a3;
            if ((pcVar3[i] & 0xfcU) != 4) {
LAB_003ba1e1:
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= (int)i) goto LAB_003ba1c2;
            if ((p->vFanin).pArray[i] != iOld) {
              __assert_fail("Bac_ObjFanin(p, iCo) == iOld",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                            ,0xde,"void Bac_NtkUpdateFanout(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(&p->vFanin,i,-1);
            if ((p->vType).nSize <= (int)i) goto LAB_003ba1a3;
            if (((p->vType).pArray[i] & 0xfcU) != 4) goto LAB_003ba1e1;
            if ((p->vFanin).nSize <= (int)i) goto LAB_003ba1c2;
            if ((p->vFanin).pArray[i] != -1) {
              __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
            }
            Vec_IntSetEntry(&p->vFanin,i,iNew);
            uVar2 = (p->vType).nSize;
            if ((int)uVar2 <= (int)i) goto LAB_003ba1a3;
            pcVar3 = (p->vType).pArray;
            if ((pcVar3[i] & 0xfcU) != 4) {
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                            ,0x126,"int Bac_ObjNextFanout(Bac_Ntk_t *, int)");
            }
            iVar5 = (p->vFanout).nSize;
            if (iVar5 <= (int)i) goto LAB_003ba1c2;
            piVar4 = (p->vFanout).pArray;
            i = piVar4[i];
          } while (i != 0);
        }
        if ((int)uVar2 <= iOld) goto LAB_003ba1a3;
        if ((9 < (byte)pcVar3[(uint)iOld]) ||
           ((0x30cU >> ((byte)pcVar3[(uint)iOld] & 0x1f) & 1) == 0)) goto LAB_003ba25d;
        if (iVar5 <= iOld) goto LAB_003ba1c2;
        if (iNew < (int)uVar2) {
          if (((byte)pcVar3[(uint)iNew] < 10) &&
             ((0x30cU >> ((byte)pcVar3[(uint)iNew] & 0x1f) & 1) != 0)) {
            Vec_IntSetEntry(&p->vFanout,iNew,piVar4[(uint)iOld]);
            if ((p->vType).nSize <= iOld) goto LAB_003ba1a3;
            uVar2 = (uint)(byte)(p->vType).pArray[(uint)iOld];
            if ((uVar2 < 10) && ((0x30cU >> (uVar2 & 0x1f) & 1) != 0)) {
              Vec_IntSetEntry(&p->vFanout,iOld,0);
              return;
            }
          }
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x127,"void Bac_ObjSetFanout(Bac_Ntk_t *, int, int)");
        }
      }
    }
  }
LAB_003ba1a3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

void Bac_NtkUpdateFanout( Bac_Ntk_t * p, int iOld, int iNew )
{
    int iCo;
    assert( Bac_ObjIsCi(p, iOld) );
    assert( Bac_ObjIsCi(p, iNew) );
    Bac_ObjForEachFanout( p, iOld, iCo )
    {
        assert( Bac_ObjFanin(p, iCo) == iOld );
        Bac_ObjCleanFanin( p, iCo );
        Bac_ObjSetFanin( p, iCo, iNew );
    }
    Bac_ObjSetFanout( p, iNew, Bac_ObjFanout(p, iOld) );
    Bac_ObjSetFanout( p, iOld, 0 );
}